

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int jas_stream_copy(jas_stream_t *out,jas_stream_t *in,int n)

{
  byte *pbVar1;
  uchar *puVar2;
  int iVar3;
  bool bVar4;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_30;
  int m;
  int c;
  int all;
  int n_local;
  jas_stream_t *in_local;
  jas_stream_t *out_local;
  
  local_30 = n;
  while( true ) {
    if (n >= 0 && local_30 < 1) {
      return 0;
    }
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar3 = in->cnt_ + -1;
        in->cnt_ = iVar3;
        if (iVar3 < 0) {
          local_3c = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar1 = in->ptr_;
          in->ptr_ = pbVar1 + 1;
          local_3c = (uint)*pbVar1;
        }
        local_38 = local_3c;
      }
      else {
        in->flags_ = in->flags_ | 4;
        local_38 = 0xffffffff;
      }
      local_40 = local_38;
    }
    else {
      local_40 = 0xffffffff;
    }
    if (local_40 == 0xffffffff) break;
    if ((out->flags_ & 7U) == 0) {
      if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
        out->bufmode_ = out->bufmode_ | 0x20;
        iVar3 = out->cnt_ + -1;
        out->cnt_ = iVar3;
        if (iVar3 < 0) {
          local_4c = jas_stream_flushbuf(out,local_40 & 0xff);
        }
        else {
          out->rwcnt_ = out->rwcnt_ + 1;
          puVar2 = out->ptr_;
          out->ptr_ = puVar2 + 1;
          *puVar2 = (uchar)local_40;
          local_4c = local_40 & 0xff;
        }
        local_48 = local_4c;
      }
      else {
        out->flags_ = out->flags_ | 4;
        local_48 = 0xffffffff;
      }
      local_50 = local_48;
    }
    else {
      local_50 = 0xffffffff;
    }
    if (local_50 == 0xffffffff) {
      return -1;
    }
    local_30 = local_30 + -1;
  }
  bVar4 = true;
  if (n < 0) {
    bVar4 = (in->flags_ & 2U) != 0;
  }
  if (!bVar4) {
    return 0;
  }
  return -1;
}

Assistant:

int jas_stream_copy(jas_stream_t *out, jas_stream_t *in, int n)
{
	int all;
	int c;
	int m;

	all = (n < 0) ? 1 : 0;

	m = n;
	while (all || m > 0) {
		if ((c = jas_stream_getc_macro(in)) == EOF) {
			/* The next character of input could not be read. */
			/* Return with an error if an I/O error occured
			  (not including EOF) or if an explicit copy count
			  was specified. */
			return (!all || jas_stream_error(in)) ? (-1) : 0;
		}
		if (jas_stream_putc_macro(out, c) == EOF) {
			return -1;
		}
		--m;
	}
	return 0;
}